

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin2dedma_nvidia.c
# Opt level: O3

void txt_memory_dump(mmt_memory_dump_prefix *d,mmt_buf *b,void *state)

{
  uint uVar1;
  ulong uVar2;
  
  if ((d->str).len != 0) {
    fprintf(_stdout,"--0000-- %s",d + 1);
    uVar1 = b->len;
    if (3 < uVar1) {
      uVar2 = 0;
      do {
        fprintf(_stdout,"0x%08x ",(ulong)b[uVar2 + 1].len);
        uVar2 = uVar2 + 1;
        uVar1 = b->len;
      } while (uVar2 < uVar1 >> 2);
    }
    if ((uVar1 & 3) != 0) {
      uVar2 = (ulong)(uVar1 & 0xfffffffc);
      do {
        fprintf(_stdout,"%02x ",(ulong)*(byte *)((long)&b[1].len + uVar2));
        uVar2 = uVar2 + 1;
      } while (uVar2 < b->len);
    }
    fputc(10,_stdout);
    return;
  }
  return;
}

Assistant:

static void txt_memory_dump(struct mmt_memory_dump_prefix *d, struct mmt_buf *b, void *state)
{
	if (d->str.len == 0)
		return;

	fprintf(stdout, PFX "%s", d->str.data);

	uint32_t i;
	for (i = 0; i < b->len / 4; ++i)
		fprintf(stdout, "0x%08x ", ((uint32_t *)b->data)[i]);
	if (b->len & 3)
		for (i = b->len & 0xfffffffc; i < b->len; ++i)
			fprintf(stdout, "%02x ", b->data[i]);

	fprintf(stdout, "\n");
}